

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

int __thiscall Player::fortify(Player *this)

{
  string *psVar1;
  pointer pcVar2;
  Country *fromCountry;
  pointer ppCVar3;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> countries;
  int iVar4;
  uint uVar5;
  int iVar6;
  PlayerState *pPVar7;
  ostream *poVar8;
  pointer ppCVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 *puVar12;
  char *pcVar13;
  long in_stack_ffffffffffffffa0;
  pointer in_stack_ffffffffffffffa8;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> local_48;
  
  operator_delete(this->currentState,4);
  pPVar7 = (PlayerState *)operator_new(4);
  *pPVar7 = FORTIFYING;
  this->currentState = pPVar7;
  notifyAll(this);
  psVar1 = this->strategy->strategyName;
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  puVar12 = &stack0xffffffffffffffa8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff98,pcVar2,pcVar2 + psVar1->_M_string_length);
  iVar4 = std::__cxx11::string::compare(&stack0xffffffffffffff98);
  if (puVar12 != &stack0xffffffffffffffa8) {
    operator_delete(puVar12,(long)in_stack_ffffffffffffffa8 + 1);
  }
  if (iVar4 == 0) {
    iVar4 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,6);
    return (int)(char)iVar4;
  }
  while( true ) {
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13e528);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n[PLAYER ",9);
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"] Do you wish to fortify a country this turn (y/n)? ",0x34);
    uVar5 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,6);
    if ((char)uVar5 == 'n') break;
    if ((uVar5 & 0xff) == 0x79) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nPlayer ",8);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," has chosen to fortify!",0x17);
      iVar4 = 10;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      goto LAB_0010c866;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nInvalid input. Try again.\n",0x1b);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nPlayer ",8);
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,*this->pPlayerId);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," has chosen NOT to fortify!",0x1b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  goto LAB_0010ca40;
LAB_0010ca91:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nCountry ",9);
  pcVar13 = &stack0xffffffffffffffa8;
  pcVar2 = (fromCountry->cyName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff98,pcVar2,
             pcVar2 + fromCountry->cyName->_M_string_length);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,pcVar13,in_stack_ffffffffffffffa0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," has ",5);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," neighbours",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (pcVar13 != &stack0xffffffffffffffa8) {
    operator_delete(pcVar13,(long)in_stack_ffffffffffffffa8 + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Which of YOUR countries would you like to move your armies to ? (0 to ",0x46);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
  uVar5 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,8);
  if ((int)uVar5 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nInvalid input. Try again.\n",0x1b);
  }
  else {
    ppCVar9 = (fromCountry->pAdjCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar3 = (fromCountry->pAdjCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar10 = (long)ppCVar3 - (long)ppCVar9 >> 3;
    if ((int)uVar5 < (int)uVar10) {
      uVar11 = (ulong)uVar5;
      if (uVar10 <= uVar11) goto LAB_0010cde6;
      if ((ppCVar9 == ppCVar3) || (*this->pPlayerId != *ppCVar9[uVar11]->pPlayerOwnerId)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "\nEither you don\'t own this country or the country has no neighbours.\n",0x45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Skip turn.\n",0xb)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        return -1;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nInvalid input. Try again.\n",0x1b);
      ppCVar9 = (fromCountry->pAdjCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar10 = (long)(fromCountry->pAdjCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppCVar9 >> 3;
    }
    if ((int)uVar5 < (int)uVar10) {
      uVar11 = (ulong)uVar5;
      if (uVar10 <= uVar11) goto LAB_0010cde6;
      if (*this->pPlayerId == *ppCVar9[uVar11]->pPlayerOwnerId) goto LAB_0010cce0;
    }
  }
  iVar4 = iVar4 + -1;
  if (iVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "\nInvalid user input for 10 consecutive prompts, aborting action.\n",0x41);
    return -1;
  }
  goto LAB_0010ca91;
LAB_0010cce0:
  do {
    while( true ) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nYou have ",10);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,*fromCountry->pNumberOfTroops);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," armies in this country.",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," How many would you like to move ? (0 to ",0x29);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*fromCountry->pNumberOfTroops + -1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
      iVar4 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,9);
      if (-1 < iVar4) break;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nInvalid input. Try again.\n",0x1b);
    }
    iVar6 = *fromCountry->pNumberOfTroops;
    if (iVar6 <= iVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nInvalid input. Try again.\n",0x1b);
      iVar6 = *fromCountry->pNumberOfTroops;
    }
  } while (iVar6 <= iVar4);
  ppCVar9 = (fromCountry->pAdjCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar11 < (ulong)((long)(fromCountry->pAdjCountries->
                             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar9 >> 3)) {
    executeFortify(this,fromCountry,ppCVar9[uVar11],iVar4);
    return 1;
  }
LAB_0010cde6:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11);
LAB_0010c866:
  do {
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13e528);
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector
              (&local_48,this->pOwnedCountries);
    countries.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffffa0;
    countries.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)puVar12;
    countries.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffffa8;
    showCountries(countries);
    if (local_48.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nYou own ",9);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," countries. Which country do you want to move armies from ? (choose 0 to ",
               0x49);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ) ",3);
    uVar5 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,7);
    if ((int)uVar5 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nInvalid input. Try again.\n",0x1b);
    }
    else {
      ppCVar9 = (this->pOwnedCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar10 = (long)(this->pOwnedCountries->
                     super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppCVar9 >> 3;
      if ((int)uVar5 < (int)uVar10) {
        uVar11 = (ulong)uVar5;
        if (uVar10 <= uVar11) goto LAB_0010cde6;
        if (*ppCVar9[uVar11]->pNumberOfTroops < 2) goto LAB_0010c95a;
      }
      else {
LAB_0010c95a:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nInvalid input. Try again.\n",0x1b);
        ppCVar9 = (this->pOwnedCountries->
                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar10 = (long)(this->pOwnedCountries->
                       super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)ppCVar9 >> 3;
      }
      if ((int)uVar5 < (int)uVar10) {
        uVar11 = (ulong)uVar5;
        if (uVar10 <= uVar11) goto LAB_0010cde6;
        fromCountry = ppCVar9[uVar11];
        if (1 < *fromCountry->pNumberOfTroops) {
          iVar4 = 10;
          goto LAB_0010ca91;
        }
      }
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\nInvalid user input for 10 consecutive prompts, aborting action.\n",0x41);
LAB_0010ca40:
  operator_delete(this->currentState,4);
  pPVar7 = (PlayerState *)operator_new(4);
  *pPVar7 = IDLE;
  this->currentState = pPVar7;
  (*this->strategy->_vptr_PlayerStrategy[5])();
  return 0;
}

Assistant:

int Player::fortify() {

    this->setPlayerState(PlayerState::FORTIFYING);
    this->notifyAll();
    if (this->getStrategy()->getStrategyName() == "CHEATER") {
        return (PlayerAction) this->getStrategy()->yesOrNo(StrategyContext::FORTIFY);
    }

    char playerChoice = 0;
    int fromCountryIndex = -1;
    int ctryToFortIndex = -1;
    int numArmies = -1;
    do {
        std::cin.clear();
        std::cout << "\n[PLAYER " << this->getPlayerId() << "] Do you wish to fortify a country this turn (y/n)? ";
        playerChoice = strategy->yesOrNo(StrategyContext::FORTIFY);
        if (playerChoice != 'y' && playerChoice != 'n') {
            std::cout << "\nInvalid input. Try again.\n";
            continue;
        }
    } while (playerChoice != 'y' && playerChoice != 'n');

    if (playerChoice == 'y') {
        std::cout << "\nPlayer " << this->getPlayerId() << " has chosen to fortify!" << std::endl;
        int failsafeCounter = 0;
        do {
            //avoid infinite loops in case of bot malfunction or human delaying the game
            if(failsafeCounter >= 10){
                std::cout << "\nInvalid user input for 10 consecutive prompts, aborting action.\n";
                this->setPlayerState(PlayerState::IDLE);
                this->strategy->resetChoices();
                return PlayerAction::ABORTED;
            }
            failsafeCounter++;

            std::cin.clear();
            showCountries(*this->getOwnedCountries());
            std::cout << "\nYou own " << this->getOwnedCountries()->size()
                      << " countries. Which country do you want to move armies from ? (choose 0 to "
                      << this->getOwnedCountries()->size() - 1 << " ) ";
            fromCountryIndex = strategy->intInput(StrategyContext::FORTIFY_FROM_COUNTRY);
            //new condition
            if (fromCountryIndex < 0 || fromCountryIndex > (int) this->getOwnedCountries()->size() - 1 ||
                this->getOwnedCountries()->at(fromCountryIndex)->getNumberOfTroops() <= 1) {
                std::cout << "\nInvalid input. Try again.\n";
                continue;
            }
            //new condition
        } while (fromCountryIndex < 0 || fromCountryIndex > (int) this->getOwnedCountries()->size() - 1 ||
                 this->getOwnedCountries()->at(fromCountryIndex)->getNumberOfTroops() <= 1);
    } else {
        std::cout << "\nPlayer " << this->getPlayerId() << " has chosen NOT to fortify!" << std::endl;
        this->setPlayerState(PlayerState::IDLE);
        this->strategy->resetChoices();
        return PlayerAction::ABORTED;
    }
    Map::Country *fromCountry = this->getOwnedCountries()->at(fromCountryIndex);
    int failsafeCounter = 0;
    do {
        //avoid infinite loops in case of bot malfunction or human delaying the game
        if(failsafeCounter >= 10){
            std::cout << "\nInvalid user input for 10 consecutive prompts, aborting action.\n";
            return -1;
        }
        failsafeCounter++;
        std::cout << "\nCountry " << fromCountry->getCountryName() << " has " << fromCountry->getAdjCountries()->size() << " neighbours" << std::endl;
        std::cout << "Which of YOUR countries would you like to move your armies to ? (0 to " << fromCountry->getAdjCountries()->size() - 1 << ") ";

        ctryToFortIndex = strategy->intInput(StrategyContext::FORTIFY_TO_COUNTRY);

        if (ctryToFortIndex < 0 || ctryToFortIndex > (int) fromCountry->getAdjCountries()->size() - 1) {
            std::cout << "\nInvalid input. Try again.\n";
            continue;
        }
        if (getPlayerId() != fromCountry->getAdjCountries()->at(ctryToFortIndex)->getPlayerOwnerID() ||
            fromCountry->getAdjCountries()->empty()) {
            std::cout << "\nEither you don't own this country or the country has no neighbours.\n"
                      << "Skip turn.\n" << std::endl;
            return -1;
        }
    } while (ctryToFortIndex < 0 || ctryToFortIndex > (int) fromCountry->getAdjCountries()->size() - 1 ||
             getPlayerId() != fromCountry->getAdjCountries()->at(ctryToFortIndex)->getPlayerOwnerID());

    do {
        std::cout << "\nYou have " << fromCountry->getNumberOfTroops() << " armies in this country."
                  << " How many would you like to move ? (0 to " << fromCountry->getNumberOfTroops() - 1 << ") ";
        numArmies = strategy->intInput(StrategyContext::FORTIFY_ARMY_COUNT);
        if (numArmies < 0 || numArmies > fromCountry->getNumberOfTroops() - 1) {
            std::cout << "\nInvalid input. Try again.\n";
            continue;
        }
    } while (numArmies < 0 || numArmies > fromCountry->getNumberOfTroops() - 1);

    Map::Country *countryToFortify = fromCountry->getAdjCountries()->at(ctryToFortIndex);

    return this->executeFortify(*fromCountry, *countryToFortify, numArmies);
}